

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_DrawPSprite
               (DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
               double ticfrac)

{
  visstyle_t *pvVar1;
  vissprite_t *vis;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  lighttable_t *plVar5;
  undefined1 auVar6 [16];
  double dVar7;
  bool bVar8;
  vissprite_t *pvVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  PalEntry fade;
  FTexture *this;
  ulong uVar13;
  AActor *p;
  AWeapon *pAVar14;
  AInventory *pAVar15;
  long lVar16;
  short sVar17;
  uint uVar18;
  long lVar19;
  short sVar20;
  int iVar21;
  uint uVar22;
  lighttable_t *plVar23;
  FDynamicColormap *pFVar24;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  int iVar33;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  FDynamicColormap *local_98;
  FRenderStyle style;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_58._8_4_ = in_XMM3_Dc;
  local_58._0_8_ = wy;
  local_58._12_4_ = in_XMM3_Dd;
  local_48._8_4_ = in_XMM2_Dc;
  local_48._0_8_ = wx;
  local_48._12_4_ = in_XMM2_Dd;
  if ((R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') &&
     (iVar33 = __cxa_guard_acquire(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)
                                    ::avis), iVar33 != 0)) {
    R_DrawPSprite::avis = (TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>)ZEXT816(0);
    __cxa_atexit(TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::~TArray,
                 &R_DrawPSprite::avis,&__dso_handle);
    __cxa_guard_release(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis);
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Reserve
              (&R_DrawPSprite::avis,(R_DrawPSprite::avis.Count - vispspindex) + 1);
  }
  uVar4 = pspr->Sprite;
  if (sprites.Count <= uVar4) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar4].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar19 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar4].spriteframes;
  uVar3 = SpriteFrames.Array[lVar19].Flip;
  this = FTextureManager::operator()
                   (&TexMan,(FTextureID)SpriteFrames.Array[lVar19].Texture[0].texnum,false);
  if (this->UseType == '\r') {
    return;
  }
  if (pspr->firstTic == false) {
    auVar30._0_8_ = pspr->x;
    auVar30._8_8_ = pspr->y;
    uVar25 = *(undefined4 *)&pspr->oldx;
    uVar26 = *(undefined4 *)((long)&pspr->oldx + 4);
    uVar27 = *(undefined4 *)&pspr->oldy;
    uVar28 = *(undefined4 *)((long)&pspr->oldy + 4);
  }
  else {
    pspr->firstTic = false;
    auVar30._0_8_ = pspr->x;
    auVar30._8_8_ = pspr->y;
    pspr->oldx = (double)auVar30._0_8_;
    pspr->oldy = (double)auVar30._8_8_;
    uVar25 = (undefined4)auVar30._0_8_;
    uVar26 = (undefined4)((ulong)auVar30._0_8_ >> 0x20);
    uVar27 = (undefined4)auVar30._8_8_;
    uVar28 = (undefined4)((ulong)auVar30._8_8_ >> 0x20);
  }
  iVar33 = -(uint)((pspr->Flags & 2U) == 0);
  auVar31._4_4_ = iVar33;
  auVar31._0_4_ = iVar33;
  auVar31._8_4_ = iVar33;
  auVar31._12_4_ = iVar33;
  auVar6._8_4_ = SUB84((double)boby,0);
  auVar6._0_8_ = (double)bobx;
  auVar6._12_4_ = (int)((ulong)(double)boby >> 0x20);
  dVar29 = SUB168(~auVar31 & auVar6,0) + ticfrac * (auVar30._0_8_ - (double)CONCAT44(uVar26,uVar25))
           + (double)CONCAT44(uVar26,uVar25);
  dVar32 = SUB168(~auVar31 & auVar6,8) + ticfrac * (auVar30._8_8_ - (double)CONCAT44(uVar28,uVar27))
           + (double)CONCAT44(uVar28,uVar27) + 0.375;
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar29 = dVar29 + (double)local_48._0_8_;
    dVar32 = dVar32 + (double)local_58._0_8_;
  }
  iVar33 = FTexture::GetScaledLeftOffset(this);
  dVar7 = (dVar29 + -160.0) - (double)iVar33;
  dVar29 = CenterX + 6755399441055744.0 + pspritexscale * dVar7;
  iVar33 = SUB84(dVar29,0);
  if (viewwidth < iVar33) {
    return;
  }
  iVar11 = FTexture::GetScaledWidth(this);
  dVar7 = CenterX + 6755399441055744.0 + (dVar7 + (double)iVar11) * pspritexscale;
  iVar11 = SUB84(dVar7,0);
  if (iVar11 < 1) {
    return;
  }
  uVar13 = (ulong)vispspindex;
  pvVar9 = R_DrawPSprite::avis.Array;
  R_DrawPSprite::avis.Array[uVar13].renderflags = (short)(owner->renderflags).Value;
  pvVar9[uVar13].floorclip = 0.0;
  vis = pvVar9 + uVar13;
  pvVar9[uVar13].field_14.field_0.texturemid =
       (double)(int)this->TopOffset + (100.0 - dVar32) * (this->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = GC::ReadBarrier<AActor>((AActor **)&pspr->Caller);
    pAVar14 = dyn_cast<AWeapon>((DObject *)p);
    if ((pAVar14 != (AWeapon *)0x0) && (fVar2 = pAVar14->YAdjust, fVar2 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar32 = (double)fVar2 * StatusBar->Displacement;
      }
      else {
        dVar32 = (double)fVar2;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar32;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    dVar32 = AspectPspriteOffset(WidescreenRatio);
    (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar32;
  }
  iVar12 = 0;
  sVar17 = 0;
  if (0 < iVar33) {
    sVar17 = SUB82(dVar29,0);
  }
  vis->x1 = sVar17;
  sVar20 = (short)viewwidth;
  if (iVar11 < viewwidth) {
    sVar20 = SUB82(dVar7,0);
  }
  vis->x2 = sVar20;
  vis->xscale = SUB84(pspritexscale / (this->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (this->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = this;
  vis->ColormapNum = '\0';
  iVar11 = SUB84((this->Scale).X * pspritexiscale + 103079215104.0,0);
  if (((uint)pspr->Flags >> 6 & 1) == (uVar3 & 1 ^ 1)) {
    iVar11 = -iVar11;
    (vis->field_14).field_0.xiscale = iVar11;
    iVar12 = *(int *)&this->Width * 0x10000 + -1;
  }
  else {
    (vis->field_14).field_0.xiscale = iVar11;
  }
  iVar21 = 0;
  if (iVar33 < sVar17) {
    iVar21 = (sVar17 - iVar33) * iVar11;
  }
  (vis->field_14).field_0.startfrac = iVar21 + iVar12;
  local_98 = basecolormap;
  if (pspr->ID < 0x7ffffffd) {
    (vis->Style).Alpha = (float)owner->Alpha;
    uVar4 = (owner->RenderStyle).AsDWORD;
    uVar22 = uVar4 >> 0x18 & 0x20;
    uVar18 = uVar22 >> 5 ^ 1;
    if ((uVar4 >> 0x1c & 1) == 0) {
      uVar18 = uVar22;
    }
    (vis->Style).RenderStyle.AsDWORD = uVar4;
    local_98 = basecolormap;
    if ((uVar4 >> 0x1e & 1) != 0) {
      fade_00.d = 0xffffff;
      if (uVar18 == 0) {
        fade_00.d = 0;
      }
      local_98 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                                  basecolormap->Desaturate);
      uVar18 = 0;
    }
    pvVar1 = &vis->Style;
    if (realfixedcolormap == 0) {
      if (uVar18 != 0) {
        color = (local_98->Color).field_0.field_0;
        fade = PalEntry::InverseColor(&local_98->Fade);
        local_98 = GetSpecialLights((PalEntry)color,fade,local_98->Desaturate);
      }
      if ((long)fixedlightlev < 0) {
        if ((foggy == '\0') && ((pspr->State->StateFlags & 4) != 0)) {
          pFVar24 = local_98;
          if (r_fullbrightignoresectorcolor.Value != false) {
            pFVar24 = &FullNormalLight;
          }
          plVar23 = pFVar24->Maps;
        }
        else {
          iVar11 = 0x1f;
          if (spriteshade._2_2_ < 0x1f) {
            iVar11 = (int)spriteshade._2_2_;
          }
          iVar12 = 0;
          if (0 < iVar11) {
            iVar12 = iVar11;
          }
          plVar23 = local_98->Maps + (uint)(iVar12 << 8);
        }
      }
      else {
        pFVar24 = local_98;
        if (r_fullbrightignoresectorcolor.Value != false) {
          pFVar24 = &FullNormalLight;
        }
        plVar23 = pFVar24->Maps + fixedlightlev;
      }
    }
    else {
      plVar23 = (lighttable_t *)(realfixedcolormap + 0x18);
    }
    pvVar1->colormap = plVar23;
    pAVar15 = GC::ReadBarrier<AInventory>((AInventory **)&camera->Inventory);
    if (pAVar15 == (AInventory *)0x0) {
LAB_003146e1:
      bVar10 = false;
    }
    else {
      plVar23 = pvVar1->colormap;
      pAVar15 = GC::ReadBarrier<AInventory>((AInventory **)&camera->Inventory);
      (*(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2e])(pAVar15,pvVar1);
      plVar5 = pvVar1->colormap;
      if (plVar5 == plVar23) goto LAB_003146e1;
      bVar10 = true;
      if (((SpecialColormaps.Array)->Colormap <= plVar5) &&
         (plVar5 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
        bVar10 = local_98->Maps + 0x2000 <= plVar5 || plVar5 < local_98->Maps;
      }
    }
    bVar8 = bVar10;
    if (((r_shadercolormaps.Value == false) &&
        ((SpecialColormaps.Array)->Colormap <= pvVar1->colormap)) &&
       (bVar8 = true, SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar1->colormap
       )) {
      bVar8 = bVar10;
    }
    bVar10 = true;
    if (NormalLight.Maps == realcolormaps) {
      bVar10 = bVar8;
    }
    if (local_98 == &NormalLight) {
      bVar8 = bVar10;
    }
    if (((!bVar8) && (realfixedcolormap == 0)) &&
       ((local_98 == &NormalLight &&
        (((NormalLightHasFixedLights & 1U) != 0 &&
         (iVar11 = (*((vis->field_13).pic)->_vptr_FTexture[5])(), bVar8 = bVar10,
         (char)iVar11 != '\0')))))) {
      bVar8 = true;
    }
    pFVar24 = local_98;
    if (-1 < fixedlightlev) {
      pFVar24 = &FullNormalLight;
    }
    if (r_fullbrightignoresectorcolor.Value != false) {
      local_98 = pFVar24;
    }
    if (((r_fullbrightignoresectorcolor.Value == true) && (foggy == '\0')) &&
       ((pspr->State->StateFlags & 4) != 0)) {
      local_98 = &FullNormalLight;
    }
    if (bVar8) goto LAB_003147e5;
  }
  else {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
  }
  if (((DFrameBuffer *)RenderTarget == screen) && (screen->Accel2D != false)) {
    style = (vis->Style).RenderStyle;
    FRenderStyle::CheckFuzz(&style);
    if (style.field_0.BlendOp != '\x04') {
      if (DAT_017a0cec < vispspindex + 1) {
        TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Reserve
                  ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)&vispsprites,
                   (DAT_017a0cec - vispspindex) + 1);
      }
      lVar19 = vispsprites;
      lVar16 = (ulong)vispspindex * 0x18;
      *(vissprite_t **)(vispsprites + lVar16) = vis;
      *(FDynamicColormap **)(lVar19 + 8 + lVar16) = local_98;
      *(int *)(lVar19 + 0x10 + lVar16) = iVar33;
      vispspindex = vispspindex + 1;
      return;
    }
  }
LAB_003147e5:
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac + WEAPON_FUDGE_Y;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= AspectPspriteOffset(WidescreenRatio);
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (!(flip) != !(pspr->Flags & PSPF_FLIP))
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? (FullNormalLight.Maps + fixedlightlev) : (mybasecolormap->Maps + fixedlightlev);
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		// [SP] If emulating GZDoom fullbright, disable acceleration
		if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			mybasecolormap = &FullNormalLight;
		if (r_fullbrightignoresectorcolor && !foggy && pspr->GetState()->GetFullbright())
			mybasecolormap = &FullNormalLight;
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}